

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

int read_AEDR(coda_cdf_product *product_file,int64_t offset,char *name,int32_t scope)

{
  coda_cdf_variable *type;
  char cVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  coda_dynamic_type *pcVar23;
  int iVar24;
  coda_type_array *type_00;
  coda_type_array *type_01;
  undefined4 uVar25;
  undefined8 extraout_RDX;
  coda_type_class type_class;
  coda_type_class read_type;
  char *pcVar26;
  coda_type_array *type_02;
  coda_mem_array *type_03;
  long lVar27;
  long lVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  uint uVar31;
  ulong offset_00;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  coda_type_class local_94;
  int local_70;
  int local_6c;
  uint local_68;
  undefined4 local_64;
  coda_mem_array *local_60;
  uint local_54;
  long local_50;
  coda_dynamic_type *attribute;
  ulong local_40;
  ulong local_38;
  
  if (offset == 0) {
    return 0;
  }
  iVar24 = read_bytes(product_file->raw_product,offset + 8,4,&local_54);
  if (iVar24 < 0) {
    return -1;
  }
  auVar30 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(local_54
                                                                                           >> 0x18)
                                                                             << 0x30) >> 0x28),
                                                                     CONCAT14((char)(local_54 >>
                                                                                    0x10),local_54))
                                                           >> 0x20),local_54) >> 0x18),
                                      (char)(local_54 >> 8)),(ushort)(byte)local_54) &
                    0xffffff00ffffff);
  auVar30 = pshuflw(auVar30,auVar30,0x1b);
  sVar3 = auVar30._0_2_;
  sVar4 = auVar30._2_2_;
  sVar5 = auVar30._4_2_;
  sVar6 = auVar30._6_2_;
  uVar29 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar30[6] - (0xff < sVar6),
                    CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar30[4] - (0xff < sVar5),
                             CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar30[2] - (0xff < sVar4),
                                      (0 < sVar3) * (sVar3 < 0x100) * auVar30[0] - (0xff < sVar3))))
  ;
  local_54 = uVar29;
  if ((uVar29 != 5) && (uVar29 != 9)) {
    pcVar26 = "CDF file has invalid record type (%d) for AEDR record";
    iVar24 = -300;
    goto LAB_001228ab;
  }
  iVar24 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_40);
  if (iVar24 < 0) {
    return -1;
  }
  iVar24 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_64);
  if (iVar24 < 0) {
    return -1;
  }
  iVar24 = read_bytes(product_file->raw_product,offset + 0x18,4,&local_68);
  if (iVar24 < 0) {
    return -1;
  }
  iVar24 = read_bytes(product_file->raw_product,offset + 0x1c,4,&local_6c);
  if (iVar24 < 0) {
    return -1;
  }
  iVar24 = read_bytes(product_file->raw_product,offset + 0x20,4,&local_70);
  if (iVar24 < 0) {
    return -1;
  }
  auVar11._8_6_ = 0;
  auVar11._0_8_ = local_40;
  auVar11[0xe] = (char)(local_40 >> 0x38);
  auVar12._8_4_ = 0;
  auVar12._0_8_ = local_40;
  auVar12[0xc] = (char)(local_40 >> 0x30);
  auVar12._13_2_ = auVar11._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = local_40;
  auVar13._12_3_ = auVar12._12_3_;
  auVar14._8_2_ = 0;
  auVar14._0_8_ = local_40;
  auVar14[10] = (char)(local_40 >> 0x28);
  auVar14._11_4_ = auVar13._11_4_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = local_40;
  auVar15._10_5_ = auVar14._10_5_;
  auVar16[8] = (char)(local_40 >> 0x20);
  auVar16._0_8_ = local_40;
  auVar16._9_6_ = auVar15._9_6_;
  auVar30[7] = 0;
  auVar30._0_7_ = auVar16._8_7_;
  auVar19._7_8_ = 0;
  auVar19._0_7_ = auVar16._8_7_;
  auVar21._1_8_ = SUB158(auVar19 << 0x40,7);
  auVar21[0] = (char)(local_40 >> 0x18);
  auVar21._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar20[0] = (char)(local_40 >> 0x10);
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar20;
  auVar17[2] = (char)(local_40 >> 8);
  auVar17._0_2_ = (ushort)local_40;
  auVar17._3_12_ = SUB1512(auVar22 << 0x20,3);
  auVar18._2_13_ = auVar17._2_13_;
  auVar18._0_2_ = (ushort)local_40 & 0xff;
  auVar30._8_4_ = auVar18._0_4_;
  auVar30._12_4_ = auVar20._0_4_;
  auVar30 = pshuflw(auVar30,auVar30,0x1b);
  auVar30 = pshufhw(auVar30,auVar30,0x1b);
  sVar3 = auVar30._0_2_;
  sVar4 = auVar30._2_2_;
  sVar5 = auVar30._4_2_;
  sVar6 = auVar30._6_2_;
  sVar7 = auVar30._8_2_;
  sVar8 = auVar30._10_2_;
  sVar9 = auVar30._12_2_;
  sVar10 = auVar30._14_2_;
  cVar1 = (0 < sVar10) * (sVar10 < 0x100) * auVar30[0xe] - (0xff < sVar10);
  offset_00 = CONCAT17(cVar1,CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar30[0xc] - (0xff < sVar9),
                                      CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar30[10] -
                                               (0xff < sVar8),
                                               CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar30[8] -
                                                        (0xff < sVar7),
                                                        CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                                 auVar30[6] - (0xff < sVar6),
                                                                 CONCAT12((0 < sVar5) *
                                                                          (sVar5 < 0x100) *
                                                                          auVar30[4] -
                                                                          (0xff < sVar5),
                                                                          CONCAT11((0 < sVar4) *
                                                                                   (sVar4 < 0x100) *
                                                                                   auVar30[2] -
                                                                                   (0xff < sVar4),
                                                                                   (0 < sVar3) *
                                                                                   (sVar3 < 0x100) *
                                                                                   auVar30[0] -
                                                                                   (0xff < sVar3))))
                                                       ))));
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_64 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_64 >> 0x10),local_64))
                                                  >> 0x20),local_64) >> 0x18),
                                       CONCAT12((char)((uint)local_64 >> 8),(short)local_64)) >>
                             0x10),(short)local_64) & 0xffff00ff00ff00ff;
  auVar30 = pshuflw(auVar32,auVar32,0x1b);
  sVar3 = auVar30._0_2_;
  sVar4 = auVar30._2_2_;
  sVar5 = auVar30._4_2_;
  sVar6 = auVar30._6_2_;
  cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar30[6] - (0xff < sVar6);
  local_64 = CONCAT13(cVar2,CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar30[4] - (0xff < sVar5),
                                     CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar30[2] -
                                              (0xff < sVar4),
                                              (0 < sVar3) * (sVar3 < 0x100) * auVar30[0] -
                                              (0xff < sVar3))));
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_68 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_68 >> 0x10),local_68)) >>
                                                  0x20),local_68) >> 0x18),
                                       CONCAT12((char)(local_68 >> 8),(short)local_68)) >> 0x10),
                       (short)local_68) & 0xffff00ff00ff00ff;
  auVar30 = pshuflw(auVar33,auVar33,0x1b);
  sVar3 = auVar30._0_2_;
  sVar4 = auVar30._2_2_;
  sVar5 = auVar30._4_2_;
  sVar6 = auVar30._6_2_;
  uVar31 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar30[6] - (0xff < sVar6),
                    CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar30[4] - (0xff < sVar5),
                             CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar30[2] - (0xff < sVar4),
                                      (0 < sVar3) * (sVar3 < 0x100) * auVar30[0] - (0xff < sVar3))))
  ;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_6c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_6c >> 0x10),local_6c))
                                                  >> 0x20),local_6c) >> 0x18),
                                       CONCAT12((char)((uint)local_6c >> 8),(short)local_6c)) >>
                             0x10),(short)local_6c) & 0xffff00ff00ff00ff;
  auVar30 = pshuflw(auVar34,auVar34,0x1b);
  sVar3 = auVar30._0_2_;
  sVar4 = auVar30._2_2_;
  sVar5 = auVar30._4_2_;
  sVar6 = auVar30._6_2_;
  local_6c = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar30[6] - (0xff < sVar6),
                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar30[4] - (0xff < sVar5),
                               CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar30[2] - (0xff < sVar4),
                                        (0 < sVar3) * (sVar3 < 0x100) * auVar30[0] - (0xff < sVar3))
                              ));
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_70 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_70 >> 0x10),local_70))
                                                  >> 0x20),local_70) >> 0x18),
                                       CONCAT12((char)((uint)local_70 >> 8),(short)local_70)) >>
                             0x10),(short)local_70) & 0xffff00ff00ff00ff;
  auVar30 = pshuflw((undefined1  [16])0x0,auVar35,0x1b);
  sVar3 = auVar30._0_2_;
  sVar4 = auVar30._2_2_;
  sVar5 = auVar30._4_2_;
  sVar6 = auVar30._6_2_;
  local_70 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar30[6] - (0xff < sVar6),
                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar30[4] - (0xff < sVar5),
                               CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar30[2] - (0xff < sVar4),
                                        (0 < sVar3) * (sVar3 < 0x100) * auVar30[0] - (0xff < sVar3))
                              ));
  local_68 = uVar31;
  local_40 = offset_00;
  if ((cVar1 < '\0') || (product_file->file_size <= (long)offset_00)) {
    pcVar26 = "CDF file has invalid offset for AEDR record";
LAB_001228ca:
    iVar24 = -300;
LAB_001228cf:
    coda_set_error(iVar24,pcVar26);
    return -1;
  }
  if (cVar2 < '\0') {
    pcVar26 = "CDF file has invalid attribute number in AEDR record";
    goto LAB_001228ca;
  }
  lVar27 = (long)local_6c;
  if (lVar27 < 0) {
    pcVar26 = "CDF file has invalid entry number in AEDR record";
    goto LAB_001228ca;
  }
  local_50 = (long)local_70;
  if (local_50 < 0) {
    pcVar26 = "CDF file has invalid number of entries in AEDR record";
    goto LAB_001228ca;
  }
  local_94 = coda_array_class;
  type_class = coda_integer_class;
  switch(uVar31) {
  case 1:
switchD_0012287e_caseD_1:
    read_type = coda_record_class;
    break;
  case 2:
    local_94 = type_class;
    read_type = coda_integer_class;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
  case 9:
  case 10:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0012287e_caseD_3:
    pcVar26 = "invalid CDF data type (%d)";
    iVar24 = -100;
    uVar29 = uVar31;
LAB_001228ab:
    coda_set_error(iVar24,pcVar26,(ulong)uVar29);
    return -1;
  case 4:
    local_94 = coda_text_class;
    read_type = local_94;
    break;
  case 8:
switchD_0012287e_caseD_8:
    local_94 = 8;
    read_type = coda_special_class;
    break;
  case 0xb:
    read_type = local_94;
    break;
  case 0xc:
    local_94 = type_class;
    read_type = coda_real_class;
    break;
  case 0xe:
    local_94 = coda_text_class;
    read_type = coda_raw_class;
    break;
  case 0x15:
switchD_0012287e_caseD_15:
    read_type = 8;
    local_94 = coda_text_class;
    goto LAB_001229ad;
  case 0x16:
switchD_0012287e_caseD_16:
    read_type = 9;
    local_94 = 8;
LAB_001229ad:
    type_class = coda_real_class;
    break;
  default:
    switch(uVar31) {
    case 0x1f:
    case 0x2d:
      goto switchD_0012287e_caseD_16;
    case 0x20:
      pcVar26 = "CDF EPOCH16 data type is not supported";
      iVar24 = -200;
      goto LAB_001228cf;
    case 0x21:
      goto switchD_0012287e_caseD_8;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x2a:
    case 0x2b:
      goto switchD_0012287e_caseD_3;
    case 0x29:
      goto switchD_0012287e_caseD_1;
    case 0x2c:
      goto switchD_0012287e_caseD_15;
    default:
      if (1 < uVar31 - 0x33) goto switchD_0012287e_caseD_3;
      type_00 = (coda_type_array *)coda_type_text_new(coda_format_cdf);
      uVar25 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      read_type = 0xb;
      local_94 = (coda_type_class)local_50;
    }
    goto LAB_00122a39;
  }
  type_00 = (coda_type_array *)coda_type_number_new(coda_format_cdf,type_class);
  uVar25 = 0;
LAB_00122a39:
  if (type_00 == (coda_type_array *)0x0) {
    return -1;
  }
  local_60 = (coda_mem_array *)CONCAT44(local_60._4_4_,uVar25);
  iVar24 = coda_type_set_read_type((coda_type *)type_00,read_type);
  type_02 = type_00;
  if (iVar24 == 0) {
    local_38 = (ulong)local_94;
    if (((char)local_60 != '\0') ||
       ((iVar24 = coda_type_set_byte_size((coda_type *)type_00,local_38), iVar24 == 0 &&
        (iVar24 = coda_type_number_set_endianness((coda_type_number *)type_00,coda_little_endian),
        iVar24 == 0)))) {
      lVar28 = offset + 0x38;
      if (0x32 < uVar31 || (int)local_50 == 1) {
        iVar24 = read_attribute_sub(product_file,lVar28,local_94,(coda_type *)type_00,&attribute);
        coda_type_release((coda_type *)type_00);
        if (iVar24 != 0) {
          return -1;
        }
LAB_00122b19:
        if ((scope & 1U) == 0 || uVar29 != 5) {
          lVar28 = product_file->root_type->num_fields;
          if (lVar28 <= lVar27) {
            coda_set_error(-300,
                           "CDF Attribute entry number (%d) is outside range of available variables [0,%ld]"
                           ,lVar27,lVar28 + -1);
            return -1;
          }
          type = (coda_cdf_variable *)product_file->root_type->field_type[lVar27];
          if (type->backend != coda_backend_cdf) {
            __assert_fail("((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                          ,0x1cb,"int read_AEDR(coda_cdf_product *, int64_t, const char *, int32_t)"
                         );
          }
          iVar24 = coda_cdf_variable_add_attribute(type,name,attribute,1);
        }
        else {
          iVar24 = coda_mem_type_add_attribute
                             ((coda_mem_type *)product_file->root_type,name,attribute,1);
        }
        type_03 = (coda_mem_array *)attribute;
        if (iVar24 == 0) {
          iVar24 = read_AEDR(product_file,offset_00,name,scope);
          return -(uint)(iVar24 != 0);
        }
LAB_00122bbc:
        coda_dynamic_type_delete((coda_dynamic_type *)type_03);
        return -1;
      }
      type_01 = coda_type_array_new(coda_format_cdf);
      if (type_01 != (coda_type_array *)0x0) {
        iVar24 = coda_type_array_set_base_type(type_01,(coda_type *)type_00);
        if (iVar24 == 0) {
          coda_type_release((coda_type *)type_00);
          iVar24 = coda_type_array_add_variable_dimension(type_01,(coda_expression *)0x0);
          type_02 = type_01;
          if (iVar24 == 0) {
            local_60 = coda_mem_array_new(type_01,(coda_dynamic_type *)0x0);
            coda_type_release((coda_type *)type_01);
            if (local_60 == (coda_mem_array *)0x0) {
              return -1;
            }
            local_50 = local_50 + 1;
            do {
              local_50 = local_50 + -1;
              if (local_50 == 0) goto LAB_00122b19;
              iVar24 = read_attribute_sub(product_file,lVar28,local_94,(coda_type *)type_00,
                                          &attribute);
              pcVar23 = attribute;
              type_03 = local_60;
              if (iVar24 != 0) goto LAB_00122bbc;
              lVar28 = lVar28 + local_38;
              iVar24 = coda_mem_array_add_element(local_60,attribute);
            } while (iVar24 == 0);
            coda_dynamic_type_delete((coda_dynamic_type *)local_60);
            type_03 = (coda_mem_array *)pcVar23;
            goto LAB_00122bbc;
          }
        }
        else {
          coda_type_release((coda_type *)type_01);
        }
      }
    }
  }
  coda_type_release((coda_type *)type_02);
  return -1;
}

Assistant:

static int read_AEDR(coda_cdf_product *product_file, int64_t offset, const char *name, int32_t scope)
{
    coda_dynamic_type *attribute;
    int32_t record_type;
    int64_t aedr_next;
    int32_t attr_num;
    int32_t data_type;
    int32_t num;
    int32_t num_elems;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 5 && record_type != 9)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for AEDR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &aedr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &attr_num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num_elems) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&aedr_next);
    swap_int32(&attr_num);
    swap_int32(&data_type);
    swap_int32(&num);
    swap_int32(&num_elems);
#endif
    offset += 56;
    if (aedr_next < 0 || aedr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AEDR record");
        return -1;
    }
    if (attr_num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in AEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid entry number in AEDR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries in AEDR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }

    if (read_attribute(product_file, offset, data_type, num_elems, &attribute) != 0)
    {
        return -1;
    }
    if (record_type == 5 && (scope & 1))
    {
        if (coda_mem_type_add_attribute((coda_mem_type *)product_file->root_type, name, attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }
    else
    {
        if (num < 0 || num >= product_file->root_type->num_fields)
        {
            coda_set_error(CODA_ERROR_PRODUCT,
                           "CDF Attribute entry number (%d) is outside range of available variables " "[0,%ld]", num,
                           product_file->root_type->num_fields - 1);
            return -1;
        }

        assert(((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf);
        if (coda_cdf_variable_add_attribute((coda_cdf_variable *)product_file->root_type->field_type[num], name,
                                            attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }

    if (read_AEDR(product_file, aedr_next, name, scope) != 0)
    {
        return -1;
    }

    return 0;
}